

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

stringc * __thiscall irr::scene::CXMeshFileLoader::getNextToken(CXMeshFileLoader *this)

{
  u16 uVar1;
  int iVar2;
  u32 uVar3;
  CXMeshFileLoader *in_RSI;
  stringc *in_RDI;
  u32 len;
  s16 tok;
  stringc s;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  CXMeshFileLoader *in_stack_ffffffffffffff60;
  stringc *this_00;
  
  this_00 = in_RDI;
  core::string<char>::string((string<char> *)0x2e39db);
  if ((in_RSI->BinaryFormat & 1U) == 0) {
    findNextNoneWhiteSpace(in_stack_ffffffffffffff60);
    if (in_RSI->End <= *(c8 **)&(in_RSI->super_IMeshLoader).field_0x18) {
      core::string<char>::string
                ((string<char> *)in_stack_ffffffffffffff60,
                 (string<char> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      goto LAB_002e4026;
    }
    while( true ) {
      in_stack_ffffffffffffff5f = 0;
      if (*(c8 **)&(in_RSI->super_IMeshLoader).field_0x18 < in_RSI->End) {
        iVar2 = core::isspace((int)**(char **)&(in_RSI->super_IMeshLoader).field_0x18);
        in_stack_ffffffffffffff5f = (byte)iVar2 ^ 0xff;
      }
      if ((in_stack_ffffffffffffff5f & 1) == 0) goto LAB_002e400f;
      if ((((**(char **)&(in_RSI->super_IMeshLoader).field_0x18 == ';') ||
           (**(char **)&(in_RSI->super_IMeshLoader).field_0x18 == '}')) ||
          (**(char **)&(in_RSI->super_IMeshLoader).field_0x18 == '{')) ||
         (**(char **)&(in_RSI->super_IMeshLoader).field_0x18 == ',')) break;
      core::string<char>::append
                ((string<char> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
      *(long *)&(in_RSI->super_IMeshLoader).field_0x18 =
           *(long *)&(in_RSI->super_IMeshLoader).field_0x18 + 1;
    }
    uVar3 = core::string<char>::size((string<char> *)0x2e3fb3);
    if (uVar3 == 0) {
      core::string<char>::append
                ((string<char> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
      *(long *)&(in_RSI->super_IMeshLoader).field_0x18 =
           *(long *)&(in_RSI->super_IMeshLoader).field_0x18 + 1;
    }
LAB_002e400f:
    core::string<char>::string
              ((string<char> *)in_stack_ffffffffffffff60,
               (string<char> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
  else {
    uVar1 = readBinWord(in_RSI);
    in_stack_ffffffffffffff60 = (CXMeshFileLoader *)(ulong)((int)(short)uVar1 - 1);
    switch(in_stack_ffffffffffffff60) {
    case (CXMeshFileLoader *)0x0:
      uVar3 = readBinDWord(in_RSI);
      core::string<char>::string<char>
                (this_00,(char *)in_RDI,(u32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      core::string<char>::operator=(in_RDI,(string<char> *)in_stack_ffffffffffffff60);
      core::string<char>::~string((string<char> *)0x2e3a68);
      *(ulong *)&(in_RSI->super_IMeshLoader).field_0x18 =
           *(long *)&(in_RSI->super_IMeshLoader).field_0x18 + (ulong)uVar3;
      core::string<char>::string
                ((string<char> *)in_stack_ffffffffffffff60,
                 (string<char> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x1:
      uVar3 = readBinDWord(in_RSI);
      core::string<char>::string<char>
                (this_00,(char *)in_RDI,(u32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      core::string<char>::operator=(in_RDI,(string<char> *)in_stack_ffffffffffffff60);
      core::string<char>::~string((string<char> *)0x2e3ada);
      *(ulong *)&(in_RSI->super_IMeshLoader).field_0x18 =
           *(long *)&(in_RSI->super_IMeshLoader).field_0x18 + (ulong)(uVar3 + 2);
      core::string<char>::string
                ((string<char> *)in_stack_ffffffffffffff60,
                 (string<char> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x2:
      *(long *)&(in_RSI->super_IMeshLoader).field_0x18 =
           *(long *)&(in_RSI->super_IMeshLoader).field_0x18 + 4;
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    default:
      goto LAB_002e400f;
    case (CXMeshFileLoader *)0x4:
      *(long *)&(in_RSI->super_IMeshLoader).field_0x18 =
           *(long *)&(in_RSI->super_IMeshLoader).field_0x18 + 0x10;
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x5:
      uVar3 = readBinDWord(in_RSI);
      *(ulong *)&(in_RSI->super_IMeshLoader).field_0x18 =
           *(long *)&(in_RSI->super_IMeshLoader).field_0x18 + (ulong)(uVar3 << 2);
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x6:
      uVar3 = readBinDWord(in_RSI);
      *(ulong *)&(in_RSI->super_IMeshLoader).field_0x18 =
           *(long *)&(in_RSI->super_IMeshLoader).field_0x18 +
           (ulong)(uVar3 * (int)in_RSI->FloatSize);
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x9:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0xa:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0xb:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0xc:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0xd:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0xe:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0xf:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x10:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x11:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x12:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x13:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x1e:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x27:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x28:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x29:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x2a:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x2b:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x2c:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x2d:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x2e:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x2f:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x30:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x31:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x32:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      break;
    case (CXMeshFileLoader *)0x33:
      core::string<char>::string<char>
                ((string<char> *)in_stack_ffffffffffffff60,
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    }
  }
LAB_002e4026:
  core::string<char>::~string((string<char> *)0x2e4030);
  return this_00;
}

Assistant:

core::stringc CXMeshFileLoader::getNextToken()
{
	core::stringc s;

	// process binary-formatted file
	if (BinaryFormat) {
		// in binary mode it will only return NAME and STRING token
		// and (correctly) skip over other tokens.

		s16 tok = readBinWord();
		u32 len;

		// standalone tokens
		switch (tok) {
		case 1:
			// name token
			len = readBinDWord();
			s = core::stringc(P, len);
			P += len;
			return s;
		case 2:
			// string token
			len = readBinDWord();
			s = core::stringc(P, len);
			P += (len + 2);
			return s;
		case 3:
			// integer token
			P += 4;
			return "<integer>";
		case 5:
			// GUID token
			P += 16;
			return "<guid>";
		case 6:
			len = readBinDWord();
			P += (len * 4);
			return "<int_list>";
		case 7:
			len = readBinDWord();
			P += (len * FloatSize);
			return "<flt_list>";
		case 0x0a:
			return "{";
		case 0x0b:
			return "}";
		case 0x0c:
			return "(";
		case 0x0d:
			return ")";
		case 0x0e:
			return "[";
		case 0x0f:
			return "]";
		case 0x10:
			return "<";
		case 0x11:
			return ">";
		case 0x12:
			return ".";
		case 0x13:
			return ",";
		case 0x14:
			return ";";
		case 0x1f:
			return "template";
		case 0x28:
			return "WORD";
		case 0x29:
			return "DWORD";
		case 0x2a:
			return "FLOAT";
		case 0x2b:
			return "DOUBLE";
		case 0x2c:
			return "CHAR";
		case 0x2d:
			return "UCHAR";
		case 0x2e:
			return "SWORD";
		case 0x2f:
			return "SDWORD";
		case 0x30:
			return "void";
		case 0x31:
			return "string";
		case 0x32:
			return "unicode";
		case 0x33:
			return "cstring";
		case 0x34:
			return "array";
		}
	}
	// process text-formatted file
	else {
		findNextNoneWhiteSpace();

		if (P >= End)
			return s;

		while ((P < End) && !core::isspace(P[0])) {
			// either keep token delimiters when already holding a token, or return if first valid char
			if (P[0] == ';' || P[0] == '}' || P[0] == '{' || P[0] == ',') {
				if (!s.size()) {
					s.append(P[0]);
					++P;
				}
				break; // stop for delimiter
			}
			s.append(P[0]);
			++P;
		}
	}
	return s;
}